

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

void __thiscall fp::Algorithm::DFSAlgorithm(Algorithm *this,shared_ptr<fp::LandBasedRobot> *robot)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  ostream *poVar8;
  array<int,_2UL> local_2c;
  array<int,_2UL> next_node;
  array<int,_2UL> curr_node;
  char curr_direction;
  shared_ptr<fp::LandBasedRobot> *robot_local;
  Algorithm *this_local;
  
  std::shared_ptr<fp::LandBasedRobot>::operator=(&this->robot_,robot);
  peVar3 = std::__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)robot);
  iVar2 = (**peVar3->_vptr_LandBasedRobot)();
  curr_node._M_elems[0]._3_1_ = (char)iVar2;
  peVar3 = std::__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)robot);
  next_node._M_elems[0] = (*peVar3->_vptr_LandBasedRobot[0x15])();
  peVar3 = std::__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)robot);
  iVar2 = (*peVar3->_vptr_LandBasedRobot[0x16])();
  next_node._M_elems[1] = iVar2;
  memset(&local_2c,0,8);
  pvVar4 = std::array<int,_2UL>::operator[](&next_node,0);
  pvVar5 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                     (&this->node_master_,(long)*pvVar4);
  pvVar4 = std::array<int,_2UL>::operator[](&next_node,1);
  pvVar6 = std::array<fp::Node,_16UL>::operator[](pvVar5,(long)*pvVar4);
  *&(pvVar6->parent_node_)._M_elems = next_node._M_elems;
  SetDefaults(this);
  do {
    Maze::ReadMaze(&this->maze_info,next_node,curr_node._M_elems[0]._3_1_);
    FindNeighbours(this,next_node,curr_node._M_elems[0]._3_1_);
    pvVar4 = std::array<int,_2UL>::operator[](&next_node,0);
    pvVar5 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                       (&this->node_master_,(long)*pvVar4);
    pvVar4 = std::array<int,_2UL>::operator[](&next_node,1);
    pvVar6 = std::array<fp::Node,_16UL>::operator[](pvVar5,(long)*pvVar4);
    bVar1 = std::
            stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
            ::empty(&pvVar6->child_node_);
    if (bVar1) {
      pvVar4 = std::array<int,_2UL>::operator[](&next_node,0);
      pvVar5 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                         (&this->node_master_,(long)*pvVar4);
      pvVar4 = std::array<int,_2UL>::operator[](&next_node,1);
      pvVar6 = std::array<fp::Node,_16UL>::operator[](pvVar5,(long)*pvVar4);
      local_2c._M_elems = *&(pvVar6->parent_node_)._M_elems;
      poVar8 = std::operator<<((ostream *)&std::cerr,"Next is Parent Node: ");
      pvVar4 = std::array<int,_2UL>::operator[](&local_2c,0);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar4);
      poVar8 = std::operator<<(poVar8,", ");
      pvVar4 = std::array<int,_2UL>::operator[](&local_2c,1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar4);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar4 = std::array<int,_2UL>::operator[](&next_node,0);
      pvVar5 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                         (&this->node_master_,(long)*pvVar4);
      pvVar4 = std::array<int,_2UL>::operator[](&next_node,1);
      pvVar6 = std::array<fp::Node,_16UL>::operator[](pvVar5,(long)*pvVar4);
      pvVar7 = std::
               stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
               ::top(&pvVar6->child_node_);
      local_2c._M_elems = *&pvVar7->_M_elems;
      pvVar4 = std::array<int,_2UL>::operator[](&next_node,0);
      pvVar5 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                         (&this->node_master_,(long)*pvVar4);
      pvVar4 = std::array<int,_2UL>::operator[](&next_node,1);
      pvVar6 = std::array<fp::Node,_16UL>::operator[](pvVar5,(long)*pvVar4);
      std::
      stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
      ::pop(&pvVar6->child_node_);
      poVar8 = std::operator<<((ostream *)&std::cerr,"Child Node: ");
      pvVar4 = std::array<int,_2UL>::operator[](&local_2c,0);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar4);
      poVar8 = std::operator<<(poVar8,", ");
      pvVar4 = std::array<int,_2UL>::operator[](&local_2c,1);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pvVar4);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    Navigate(this,&next_node,&local_2c);
    peVar3 = std::__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->robot_);
    iVar2 = (**peVar3->_vptr_LandBasedRobot)();
    curr_node._M_elems[0]._3_1_ = (char)iVar2;
    next_node._M_elems = local_2c._M_elems;
    bVar1 = std::operator==(&next_node,&this->goal1_);
  } while ((((!bVar1) && (bVar1 = std::operator==(&next_node,&this->goal2_), !bVar1)) &&
           (bVar1 = std::operator==(&next_node,&this->goal3_), !bVar1)) &&
          (bVar1 = std::operator==(&next_node,&this->goal4_), !bVar1));
  SetDefaults(this);
  *&(this->end_goal_)._M_elems = next_node._M_elems;
  pvVar4 = std::array<int,_2UL>::operator[](&next_node,1);
  iVar2 = *pvVar4;
  pvVar4 = std::array<int,_2UL>::operator[](&next_node,0);
  API::setColor(iVar2,0xf - *pvVar4,'r');
  return;
}

Assistant:

void fp::Algorithm::DFSAlgorithm(const std::shared_ptr<fp::LandBasedRobot> &robot) {
    this->robot_ = robot;
    char curr_direction{robot->GetDirection()};
    std::array<int, 2> curr_node{robot->get_x_(), robot->get_y_()};
    std::array<int, 2> next_node{};
    this->node_master_[curr_node[0]][curr_node[1]].parent_node_ = curr_node;

    //---> Step 01: Clear all tile color <---//
    SetDefaults();
    while (true) {
        //---> Step 02: Read walls around the robot <---//
        this->maze_info.ReadMaze(curr_node, curr_direction);
        FindNeighbours(curr_node, curr_direction);
        if (!this->node_master_[curr_node[0]][curr_node[1]].child_node_.empty()) {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].child_node_.top();
            this->node_master_[curr_node[0]][curr_node[1]].child_node_.pop();
            std::cerr << "Child Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        } else {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].parent_node_;
            std::cerr << "Next is Parent Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        }
        this->Navigate(curr_node, next_node);


        //---> Step 06: Get robot current cell info <---//
        curr_direction = this->robot_->GetDirection();
        curr_node = next_node;

        //---> Step 07: Check for goal <---//
        if (curr_node == this->goal1_ || curr_node == this->goal2_ ||
            curr_node == this->goal3_ || curr_node == this->goal4_) {
            SetDefaults();
            this->end_goal_ = curr_node;
            fp::API::setColor(curr_node[1], 15 - curr_node[0], 'r');
            return;
        }
    }
    std::cerr << "\nNo path found!\n" << std::endl;
}